

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_mesh_outputs(CompilerMSL *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  SPIREntryPoint *pSVar6;
  SPIRType *pSVar7;
  SPIRVariable *pSVar8;
  SPIRType *pSVar9;
  uint uVar10;
  string access;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  uint local_80;
  uint32_t orig_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  SPIREntryPoint *local_58;
  string local_50;
  
  pSVar6 = Compiler::get_entry_point((Compiler *)this);
  uVar10 = 0;
  if ((((pSVar6->workgroup_size).id_x == 0) && (uVar10 = 0, (pSVar6->workgroup_size).id_y == 0)) &&
     ((pSVar6->workgroup_size).id_z == 0)) {
    uVar10 = (pSVar6->workgroup_size).y * (pSVar6->workgroup_size).x * (pSVar6->workgroup_size).z;
  }
  CompilerGLSL::statement<char_const(&)[49]>
            (&this->super_CompilerGLSL,
             (char (*) [49])"threadgroup_barrier(mem_flags::mem_threadgroup);");
  CompilerGLSL::statement<char_const(&)[25]>
            (&this->super_CompilerGLSL,(char (*) [25])"if (spvMeshSizes.y == 0)");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[8]>(&this->super_CompilerGLSL,(char (*) [8])0x345280);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  CompilerGLSL::statement<char_const(&)[45]>
            (&this->super_CompilerGLSL,(char (*) [45])"spvMesh.set_primitive_count(spvMeshSizes.y);"
            );
  CompilerGLSL::statement<char_const(&)[109]>
            (&this->super_CompilerGLSL,
             (char (*) [109])
             "const uint spvThreadCount [[maybe_unused]] = (gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z);"
            );
  uVar2 = (this->mesh_out_per_vertex).id;
  if (uVar2 != 0) {
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    local_80 = uVar10;
    local_58 = pSVar6;
    if (uVar10 < pSVar6->output_vertices) {
      CompilerGLSL::statement<char_const(&)[92]>
                (&this->super_CompilerGLSL,
                 (char (*) [92])
                 "for (uint spvVI = gl_LocalInvocationIndex; spvVI < spvMeshSizes.x; spvVI += spvThreadCount)"
                );
    }
    else {
      CompilerGLSL::statement<char_const(&)[44]>
                (&this->super_CompilerGLSL,
                 (char (*) [44])"const uint spvVI = gl_LocalInvocationIndex;");
      CompilerGLSL::statement<char_const(&)[46]>
                (&this->super_CompilerGLSL,
                 (char (*) [46])"if (gl_LocalInvocationIndex < spvMeshSizes.x)");
    }
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    CompilerGLSL::statement<char_const(&)[24]>
              (&this->super_CompilerGLSL,(char (*) [24])"spvPerVertex spvV = {};");
    for (uVar10 = 0;
        uVar10 < (uint)(pSVar7->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        uVar10 = uVar10 + 1) {
      uVar2 = Compiler::get_extended_member_decoration
                        ((Compiler *)this,(pSVar7->super_IVariant).self.id,uVar10,
                         SPIRVCrossDecorationInterfaceOrigID);
      uVar3 = Compiler::get_extended_member_decoration
                        ((Compiler *)this,(pSVar7->super_IVariant).self.id,uVar10,
                         SPIRVCrossDecorationInterfaceMemberIndex);
      if (uVar3 != 0xffffffff || uVar2 != 0) {
        pSVar8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,*(uint32_t *)&(pSVar8->super_IVariant).field_0xc);
        access._M_dataplus._M_p = (pointer)&access.field_2;
        access._M_string_length = 0;
        access.field_2._M_local_buf[0] = '\0';
        uVar4 = 0x7fffffff;
        if (pSVar9->basetype == Struct) {
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,uVar3,BuiltIn
                            );
          uVar4 = 0x7fffffff;
          if (bVar1) {
            uVar4 = Compiler::get_member_decoration
                              ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,uVar3,
                               BuiltIn);
            if ((4 < uVar4) || (uVar4 == 2)) goto LAB_00221423;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&local_a0,this,uVar4,3);
            ::std::operator+(&local_78,".",&local_a0);
            ::std::__cxx11::string::operator=((string *)&access,(string *)&local_78);
            ::std::__cxx11::string::~string((string *)&local_78);
          }
          else {
LAB_00221423:
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_a0,&this->super_CompilerGLSL,pSVar9,uVar3);
            ::std::operator+(&local_78,".",&local_a0);
            ::std::__cxx11::string::operator=((string *)&access,(string *)&local_78);
            ::std::__cxx11::string::~string((string *)&local_78);
          }
          ::std::__cxx11::string::~string((string *)&local_a0);
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(pSVar7->super_IVariant).self.id,uVar10,
                             DecorationIndex);
          if (bVar1) {
            orig_index = Compiler::get_member_decoration
                                   ((Compiler *)this,(TypeID)(pSVar7->super_IVariant).self.id,uVar10
                                    ,DecorationIndex);
            ::std::__cxx11::to_string(&local_50,orig_index);
            ::std::operator+(&local_a0,"[",&local_50);
            ::std::operator+(&local_78,&local_a0,"]");
            ::std::__cxx11::string::append((string *)&access);
            ::std::__cxx11::string::~string((string *)&local_78);
            ::std::__cxx11::string::~string((string *)&local_a0);
            ::std::__cxx11::string::~string((string *)&local_50);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&local_78,this,(ulong)uVar4,3);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&local_a0,this,(ulong)uVar2,1);
            CompilerGLSL::
            statement<char_const(&)[6],std::__cxx11::string,char_const(&)[2],unsigned_int_const&,char_const(&)[5],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_78,
                       (char (*) [2])0x330702,&orig_index,(char (*) [5])0x34513b,&local_a0,
                       (char (*) [8])"[spvVI]",&access,(char (*) [2])0x344fd0);
            ::std::__cxx11::string::~string((string *)&local_a0);
            ::std::__cxx11::string::~string((string *)&local_78);
          }
        }
        CompilerGLSL::to_member_name_abi_cxx11_(&local_78,&this->super_CompilerGLSL,pSVar7,uVar10);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_a0,this,(ulong)uVar2,1);
        CompilerGLSL::
        statement<char_const(&)[6],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_78,(char (*) [4])0x34513c,
                   &local_a0,(char (*) [8])"[spvVI]",&access,(char (*) [2])0x344fd0);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::__cxx11::string::~string((string *)&local_78);
        if ((uVar4 == 0) && ((this->super_CompilerGLSL).options.vertex.flip_vert_y != false)) {
          CompilerGLSL::to_member_name_abi_cxx11_(&local_78,&this->super_CompilerGLSL,pSVar7,uVar10)
          ;
          CompilerGLSL::to_member_name_abi_cxx11_(&local_a0,&this->super_CompilerGLSL,pSVar7,uVar10)
          ;
          CompilerGLSL::
          statement<char_const(&)[6],std::__cxx11::string,char_const(&)[8],char_const(&)[6],std::__cxx11::string,char_const(&)[5],char_const(&)[31]>
                    (&this->super_CompilerGLSL,(char (*) [6])"spvV.",&local_78,
                     (char (*) [8])".y = -(",(char (*) [6])"spvV.",&local_a0,(char (*) [5])0x344d32,
                     (char (*) [31])"    // Invert Y-axis for Metal");
          ::std::__cxx11::string::~string((string *)&local_a0);
          ::std::__cxx11::string::~string((string *)&local_78);
        }
        ::std::__cxx11::string::~string((string *)&access);
      }
    }
    CompilerGLSL::statement<char_const(&)[33]>
              (&this->super_CompilerGLSL,(char (*) [33])"spvMesh.set_vertex(spvVI, spvV);");
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
    pSVar6 = local_58;
    uVar10 = local_80;
  }
  if (this->builtin_mesh_primitive_indices_id != 0 || (this->mesh_out_per_primitive).id != 0) {
    if (uVar10 < pSVar6->output_primitives) {
      CompilerGLSL::statement<char_const(&)[92]>
                (&this->super_CompilerGLSL,
                 (char (*) [92])
                 "for (uint spvPI = gl_LocalInvocationIndex; spvPI < spvMeshSizes.y; spvPI += spvThreadCount)"
                );
    }
    else {
      CompilerGLSL::statement<char_const(&)[44]>
                (&this->super_CompilerGLSL,
                 (char (*) [44])"const uint spvPI = gl_LocalInvocationIndex;");
      CompilerGLSL::statement<char_const(&)[46]>
                (&this->super_CompilerGLSL,
                 (char (*) [46])"if (gl_LocalInvocationIndex < spvMeshSizes.y)");
    }
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    if (this->builtin_mesh_primitive_indices_id != 0) {
      bVar1 = Bitset::get(&pSVar6->flags,0x14b2);
      if (bVar1) {
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 0u, gl_PrimitiveTriangleIndicesEXT[spvPI].x);");
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 1u, gl_PrimitiveTriangleIndicesEXT[spvPI].y);");
        CompilerGLSL::statement<char_const(&)[77]>
                  (&this->super_CompilerGLSL,
                   (char (*) [77])
                   "spvMesh.set_index(spvPI * 3u + 2u, gl_PrimitiveTriangleIndicesEXT[spvPI].z);");
      }
      else {
        bVar1 = Bitset::get(&pSVar6->flags,0x1495);
        if (bVar1) {
          CompilerGLSL::statement<char_const(&)[73]>
                    (&this->super_CompilerGLSL,
                     (char (*) [73])
                     "spvMesh.set_index(spvPI * 2u + 0u, gl_PrimitiveLineIndicesEXT[spvPI].x);");
          CompilerGLSL::statement<char_const(&)[73]>
                    (&this->super_CompilerGLSL,
                     (char (*) [73])
                     "spvMesh.set_index(spvPI * 2u + 1u, gl_PrimitiveLineIndicesEXT[spvPI].y);");
        }
        else {
          CompilerGLSL::statement<char_const(&)[62]>
                    (&this->super_CompilerGLSL,
                     (char (*) [62])"spvMesh.set_index(spvPI, gl_PrimitivePointIndicesEXT[spvPI]);")
          ;
        }
      }
    }
    uVar2 = (this->mesh_out_per_primitive).id;
    if (uVar2 != 0) {
      pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      CompilerGLSL::statement<char_const(&)[27]>
                (&this->super_CompilerGLSL,(char (*) [27])"spvPerPrimitive spvP = {};");
      for (uVar10 = 0;
          uVar10 < (uint)(pSVar7->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          uVar10 = uVar10 + 1) {
        uVar2 = Compiler::get_extended_member_decoration
                          ((Compiler *)this,(pSVar7->super_IVariant).self.id,uVar10,
                           SPIRVCrossDecorationInterfaceOrigID);
        uVar3 = Compiler::get_extended_member_decoration
                          ((Compiler *)this,(pSVar7->super_IVariant).self.id,uVar10,
                           SPIRVCrossDecorationInterfaceMemberIndex);
        pSVar8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,uVar2);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,*(uint32_t *)&(pSVar8->super_IVariant).field_0xc);
        access._M_dataplus._M_p = (pointer)&access.field_2;
        access._M_string_length = 0;
        access.field_2._M_local_buf[0] = '\0';
        if (pSVar9->basetype == Struct) {
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,uVar3,BuiltIn
                            );
          if (bVar1) {
            uVar5 = Compiler::get_member_decoration
                              ((Compiler *)this,(TypeID)(pSVar9->super_IVariant).self.id,uVar3,
                               BuiltIn);
            if (((10 < uVar5) || ((0x680U >> (uVar5 & 0x1f) & 1) == 0)) &&
               ((uVar5 != 0x14b3 && (uVar5 != 0x1150)))) goto LAB_002218cb;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&local_a0,this,(ulong)uVar5,3);
            ::std::operator+(&local_78,".",&local_a0);
            ::std::__cxx11::string::operator=((string *)&access,(string *)&local_78);
            ::std::__cxx11::string::~string((string *)&local_78);
          }
          else {
LAB_002218cb:
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_a0,&this->super_CompilerGLSL,pSVar9,uVar3);
            ::std::operator+(&local_78,".",&local_a0);
            ::std::__cxx11::string::operator=((string *)&access,(string *)&local_78);
            ::std::__cxx11::string::~string((string *)&local_78);
          }
          ::std::__cxx11::string::~string((string *)&local_a0);
        }
        CompilerGLSL::to_member_name_abi_cxx11_(&local_78,&this->super_CompilerGLSL,pSVar7,uVar10);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_a0,this,uVar2,1);
        CompilerGLSL::
        statement<char_const(&)[6],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [6])"spvP.",&local_78,(char (*) [4])0x34513c,
                   &local_a0,(char (*) [8])"[spvPI]",&access,(char (*) [2])0x344fd0);
        ::std::__cxx11::string::~string((string *)&local_a0);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::__cxx11::string::~string((string *)&access);
      }
      CompilerGLSL::statement<char_const(&)[36]>
                (&this->super_CompilerGLSL,(char (*) [36])"spvMesh.set_primitive(spvPI, spvP);");
    }
    CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  }
  return;
}

Assistant:

void CompilerMSL::emit_mesh_outputs()
{
	auto &mode = get_entry_point();

	// predefined thread count or zero, if specialization constant is in use
	uint32_t num_invocations = 0;
	if (mode.workgroup_size.id_x == 0 && mode.workgroup_size.id_y == 0 && mode.workgroup_size.id_z == 0)
		num_invocations = mode.workgroup_size.x * mode.workgroup_size.y * mode.workgroup_size.z;

	statement("threadgroup_barrier(mem_flags::mem_threadgroup);");
	statement("if (spvMeshSizes.y == 0)");
	begin_scope();
	statement("return;");
	end_scope();
	statement("spvMesh.set_primitive_count(spvMeshSizes.y);");

	statement("const uint spvThreadCount [[maybe_unused]] = (gl_WorkGroupSize.x * gl_WorkGroupSize.y * gl_WorkGroupSize.z);");

	if (mesh_out_per_vertex != 0)
	{
		auto &type_vert = get<SPIRType>(mesh_out_per_vertex);

		if (num_invocations < mode.output_vertices)
		{
			statement("for (uint spvVI = gl_LocalInvocationIndex; spvVI < spvMeshSizes.x; spvVI += spvThreadCount)");
		}
		else
		{
			statement("const uint spvVI = gl_LocalInvocationIndex;");
			statement("if (gl_LocalInvocationIndex < spvMeshSizes.x)");
		}

		begin_scope();

		statement("spvPerVertex spvV = {};");
		for (uint32_t index = 0; index < uint32_t(type_vert.member_types.size()); ++index)
		{
			uint32_t orig_var = get_extended_member_decoration(type_vert.self, index, SPIRVCrossDecorationInterfaceOrigID);
			uint32_t orig_id = get_extended_member_decoration(type_vert.self, index, SPIRVCrossDecorationInterfaceMemberIndex);

			// Clip/cull distances are special-case
			if (orig_var == 0 && orig_id == (~0u))
				continue;

			auto &orig = get<SPIRVariable>(orig_var);
			auto &orig_type = get<SPIRType>(orig.basetype);

			// FIXME: Need to deal with complex composite IO types. These may need extra unroll, etc.

			BuiltIn builtin = BuiltInMax;
			std::string access;
			if (orig_type.basetype == SPIRType::Struct)
			{
				if (has_member_decoration(orig_type.self, orig_id, DecorationBuiltIn))
					builtin = BuiltIn(get_member_decoration(orig_type.self, orig_id, DecorationBuiltIn));

				switch (builtin)
				{
				case BuiltInPosition:
				case BuiltInPointSize:
				case BuiltInClipDistance:
				case BuiltInCullDistance:
					access = "." + builtin_to_glsl(builtin, StorageClassOutput);
					break;
				default:
					access = "." + to_member_name(orig_type, orig_id);
					break;
				}

				if (has_member_decoration(type_vert.self, index, DecorationIndex))
				{
					// Declare the Clip/CullDistance as [[user(clip/cullN)]].
					const uint32_t orig_index = get_member_decoration(type_vert.self, index, DecorationIndex);
					access += "[" + to_string(orig_index) + "]";
					statement("spvV.", builtin_to_glsl(builtin, StorageClassOutput), "[", orig_index, "] = ", to_name(orig_var), "[spvVI]", access, ";");
				}
			}

			statement("spvV.", to_member_name(type_vert, index), " = ", to_name(orig_var), "[spvVI]", access, ";");
			if (options.vertex.flip_vert_y && builtin == BuiltInPosition)
			{
				statement("spvV.", to_member_name(type_vert, index), ".y = -(", "spvV.",
				          to_member_name(type_vert, index), ".y);", "    // Invert Y-axis for Metal");
			}
		}
		statement("spvMesh.set_vertex(spvVI, spvV);");
		end_scope();
	}

	if (mesh_out_per_primitive != 0 || builtin_mesh_primitive_indices_id != 0)
	{
		if (num_invocations < mode.output_primitives)
		{
			statement("for (uint spvPI = gl_LocalInvocationIndex; spvPI < spvMeshSizes.y; spvPI += spvThreadCount)");
		}
		else
		{
			statement("const uint spvPI = gl_LocalInvocationIndex;");
			statement("if (gl_LocalInvocationIndex < spvMeshSizes.y)");
		}

		// FIXME: Need to deal with complex composite IO types. These may need extra unroll, etc.

		begin_scope();

		if (builtin_mesh_primitive_indices_id != 0)
		{
			if (mode.flags.get(ExecutionModeOutputTrianglesEXT))
			{
				statement("spvMesh.set_index(spvPI * 3u + 0u, gl_PrimitiveTriangleIndicesEXT[spvPI].x);");
				statement("spvMesh.set_index(spvPI * 3u + 1u, gl_PrimitiveTriangleIndicesEXT[spvPI].y);");
				statement("spvMesh.set_index(spvPI * 3u + 2u, gl_PrimitiveTriangleIndicesEXT[spvPI].z);");
			}
			else if (mode.flags.get(ExecutionModeOutputLinesEXT))
			{
				statement("spvMesh.set_index(spvPI * 2u + 0u, gl_PrimitiveLineIndicesEXT[spvPI].x);");
				statement("spvMesh.set_index(spvPI * 2u + 1u, gl_PrimitiveLineIndicesEXT[spvPI].y);");
			}
			else
			{
				statement("spvMesh.set_index(spvPI, gl_PrimitivePointIndicesEXT[spvPI]);");
			}
		}

		if (mesh_out_per_primitive != 0)
		{
			auto &type_prim = get<SPIRType>(mesh_out_per_primitive);
			statement("spvPerPrimitive spvP = {};");
			for (uint32_t index = 0; index < uint32_t(type_prim.member_types.size()); ++index)
			{
				uint32_t orig_var =
						get_extended_member_decoration(type_prim.self, index, SPIRVCrossDecorationInterfaceOrigID);
				uint32_t orig_id =
						get_extended_member_decoration(type_prim.self, index, SPIRVCrossDecorationInterfaceMemberIndex);
				auto &orig = get<SPIRVariable>(orig_var);
				auto &orig_type = get<SPIRType>(orig.basetype);

				BuiltIn builtin = BuiltInMax;
				std::string access;
				if (orig_type.basetype == SPIRType::Struct)
				{
					if (has_member_decoration(orig_type.self, orig_id, DecorationBuiltIn))
						builtin = BuiltIn(get_member_decoration(orig_type.self, orig_id, DecorationBuiltIn));

					switch (builtin)
					{
					case BuiltInPrimitiveId:
					case BuiltInLayer:
					case BuiltInViewportIndex:
					case BuiltInCullPrimitiveEXT:
					case BuiltInPrimitiveShadingRateKHR:
						access = "." + builtin_to_glsl(builtin, StorageClassOutput);
						break;
					default:
						access = "." + to_member_name(orig_type, orig_id);
					}
				}
				statement("spvP.", to_member_name(type_prim, index), " = ", to_name(orig_var), "[spvPI]", access, ";");
			}
			statement("spvMesh.set_primitive(spvPI, spvP);");
		}

		end_scope();
	}
}